

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

aiVector2D __thiscall Assimp::XGLImporter::ReadVec2(XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ai_real aVar4;
  char *s;
  ai_real v [2];
  char *local_20;
  aiVector2D local_18;
  
  bVar1 = SkipToText(this);
  if (bVar1) {
    iVar2 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    local_20 = (char *)CONCAT44(extraout_var,iVar2);
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      bVar1 = SkipSpaces<char>(&local_20);
      if (!bVar1) goto LAB_0050e231;
      aVar4 = fast_atof(&local_20);
      (&local_18.x)[lVar3] = aVar4;
      SkipSpaces<char>(&local_20);
      if ((lVar3 != 1) && (*local_20 != ',')) goto LAB_0050e231;
      local_20 = local_20 + 1;
    }
  }
  else {
LAB_0050e231:
    LogFunctions<Assimp::XGLImporter>::LogError((char *)0x50e236);
    local_18.x = 0.0;
    local_18.y = 0.0;
  }
  return local_18;
}

Assistant:

aiVector2D XGLImporter::ReadVec2()
{
    aiVector2D vec;

    if(!SkipToText()) {
        LogError("unexpected EOF reading vec2 contents");
        return vec;
    }
    const char* s = m_reader->getNodeData();

    ai_real v[2];
	for(int i = 0; i < 2; ++i) {
        if(!SkipSpaces(&s)) {
            LogError("unexpected EOL, failed to parse vec2");
            return vec;
        }
		
        v[i] = fast_atof(&s);

        SkipSpaces(&s);
        if (i != 1 && *s != ',') {
            LogError("expected comma, failed to parse vec2");
            return vec;
        }
        ++s;
    }
	vec.x = v[0];
	vec.y = v[1];

    return vec;
}